

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O2

MemoryRegionSection * iotlb_to_section_aarch64(CPUState *cpu,hwaddr index,MemTxAttrs attrs)

{
  uc_struct_conflict7 *puVar1;
  uint uVar2;
  
  puVar1 = cpu->uc;
  uVar2 = cpu_asidx_from_attrs(cpu,attrs);
  return ((cpu->cpu_ases[uVar2].memory_dispatch)->map).sections +
         (~*(ulong *)&puVar1->init_target_page->mask & index);
}

Assistant:

MemoryRegionSection *iotlb_to_section(CPUState *cpu,
                                      hwaddr index, MemTxAttrs attrs)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = cpu->uc;
#endif
    int asidx = cpu_asidx_from_attrs(cpu, attrs);
    CPUAddressSpace *cpuas = &cpu->cpu_ases[asidx];
    AddressSpaceDispatch *d = cpuas->memory_dispatch;
    MemoryRegionSection *sections = d->map.sections;

    return &sections[index & ~TARGET_PAGE_MASK];
}